

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O2

void duckdb::TimeConversion<int>
               (Vector *vector,ArrowArray *array,ArrowScanLocalState *scan_state,
               int64_t nested_offset,int64_t parent_offset,idx_t size,int64_t conversion)

{
  void *pvVar1;
  bool bVar2;
  ConversionException *this;
  idx_t row_idx;
  int64_t *result;
  long lVar3;
  allocator local_61;
  ArrowScanLocalState *local_60;
  long local_58;
  string local_50;
  
  result = (int64_t *)vector->data;
  local_60 = scan_state;
  local_58 = nested_offset;
  FlatVector::VerifyFlatVector(vector);
  lVar3 = parent_offset + array->offset + local_60->chunk_offset;
  if (local_58 != -1) {
    lVar3 = array->offset + local_58;
  }
  pvVar1 = array->buffers[1];
  row_idx = 0;
  do {
    if (size == row_idx) {
      return;
    }
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    if (bVar2) {
      bVar2 = TryMultiplyOperator::Operation<long,long,long>
                        ((long)*(int *)((long)pvVar1 + row_idx * 4 + lVar3 * 4),conversion,result);
      if (!bVar2) {
        this = (ConversionException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Could not convert Time to Microsecond",&local_61);
        ConversionException::ConversionException(this,&local_50);
        __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    row_idx = row_idx + 1;
    result = result + 1;
  } while( true );
}

Assistant:

static void TimeConversion(Vector &vector, ArrowArray &array, const ArrowScanLocalState &scan_state,
                           int64_t nested_offset, int64_t parent_offset, idx_t size, int64_t conversion) {
	auto tgt_ptr = FlatVector::GetData<dtime_t>(vector);
	auto &validity_mask = FlatVector::Validity(vector);
	auto src_ptr =
	    static_cast<const T *>(array.buffers[1]) + GetEffectiveOffset(array, parent_offset, scan_state, nested_offset);
	for (idx_t row = 0; row < size; row++) {
		if (!validity_mask.RowIsValid(row)) {
			continue;
		}
		if (!TryMultiplyOperator::Operation(static_cast<int64_t>(src_ptr[row]), conversion, tgt_ptr[row].micros)) {
			throw ConversionException("Could not convert Time to Microsecond");
		}
	}
}